

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecTestNotNull(Bitvec *p,u32 i)

{
  uint uVar1;
  int iVar2;
  u32 h;
  u32 bin;
  u32 i_local;
  Bitvec *p_local;
  
  i_local = i - 1;
  p_local = p;
  if (i_local < p->iSize) {
    do {
      if (p_local->iDivisor == 0) {
        if (p_local->iSize < 0xf81) {
          return (uint)(((uint)(p_local->u).aBitmap[i_local >> 3] & 1 << ((byte)i_local & 7)) != 0);
        }
        iVar2 = i_local + 1;
        while( true ) {
          h = i_local % 0x7c;
          if (*(int *)((long)&p_local->u + (ulong)h * 4) == 0) {
            return 0;
          }
          if (*(int *)((long)&p_local->u + (ulong)h * 4) == iVar2) break;
          i_local = h + 1;
        }
        return 1;
      }
      uVar1 = i_local / p_local->iDivisor;
      i_local = i_local % p_local->iDivisor;
      p_local = *(Bitvec **)((long)&p_local->u + (ulong)uVar1 * 8);
    } while (p_local != (Bitvec *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecTestNotNull(Bitvec *p, u32 i){
  assert( p!=0 );
  i--;
  if( i>=p->iSize ) return 0;
  while( p->iDivisor ){
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    p = p->u.apSub[bin];
    if (!p) {
      return 0;
    }
  }
  if( p->iSize<=BITVEC_NBIT ){
    return (p->u.aBitmap[i/BITVEC_SZELEM] & (1<<(i&(BITVEC_SZELEM-1))))!=0;
  } else{
    u32 h = BITVEC_HASH(i++);
    while( p->u.aHash[h] ){
      if( p->u.aHash[h]==i ) return 1;
      h = (h+1) % BITVEC_NINT;
    }
    return 0;
  }
}